

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall mpt::reference<mpt::layout::line>::type::type(type *this,uintptr_t initial)

{
  layout::line::line(&this->super_line,(line *)0x0);
  (this->super_line).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_0014eb58;
  (this->super_line).super_object._vptr_object = (_func_int **)&PTR_property_0014eba8;
  (this->_ref)._val = initial;
  return;
}

Assistant:

type(uintptr_t initial = 1) : _ref(initial)
		{ }